

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass-utils.h
# Opt level: O2

void __thiscall
wasm::PassUtils::FilteredPassRunner::doAdd
          (FilteredPassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  _Head_base<0UL,_wasm::Pass_*,_false> local_28;
  _Head_base<0UL,_wasm::Pass_*,_false> local_20;
  
  std::
  make_unique<wasm::PassUtils::FilteredPass,std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::unordered_set<wasm::Function*,std::hash<wasm::Function*>,std::equal_to<wasm::Function*>,std::allocator<wasm::Function*>>const&>
            ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_28,
             (unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
              *)pass);
  local_20._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (Pass *)0x0;
  PassRunner::doAdd(&this->super_PassRunner,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_20);
  if (local_20._M_head_impl != (Pass *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Pass[1])();
  }
  local_20._M_head_impl = (Pass *)0x0;
  if (local_28._M_head_impl != (Pass *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Pass[1])();
  }
  return;
}

Assistant:

void doAdd(std::unique_ptr<Pass> pass) override {
    PassRunner::doAdd(
      std::make_unique<FilteredPass>(std::move(pass), relevantFuncs));
  }